

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3Interrogator.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::IFF_Layer3Interrogator::Decode
          (IFF_Layer3Interrogator *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 *T;
  pointer pKVar1;
  pointer pKVar2;
  KUINT16 KVar3;
  KException *this_00;
  ushort uVar4;
  pointer pKVar5;
  KString local_50;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  if (KVar3 < 0x1c) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Decode","");
    KException::KException(this_00,&local_50,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar1 = (this->super_IFF_Layer3).m_vStdVarRecs.
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->super_IFF_Layer3).m_vStdVarRecs.
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar5 = pKVar1;
  if (pKVar2 != pKVar1) {
    do {
      (**pKVar5->_vptr_KRef_Ptr)(pKVar5);
      pKVar5 = pKVar5 + 1;
    } while (pKVar5 != pKVar2);
    (this->super_IFF_Layer3).m_vStdVarRecs.
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1;
  }
  if (!ignoreHeader) {
    LayerHeader::Decode((LayerHeader *)this,stream);
  }
  (*(this->super_IFF_Layer3).m_RptSim.super_DataTypeBase._vptr_DataTypeBase[3])
            (&(this->super_IFF_Layer3).m_RptSim,stream);
  (*(this->m_BasicData).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_BasicData,stream);
  KDataStream::Read<unsigned_short>(stream,&(this->super_IFF_Layer3).m_ui16Padding);
  T = &(this->super_IFF_Layer3).m_ui16NumIffRecs;
  KDataStream::Read<unsigned_short>(stream,T);
  if ((this->super_IFF_Layer3).m_ui16NumIffRecs != 0) {
    uVar4 = 0;
    do {
      StandardVariable::FactoryDecodeStandardVariable((StdVarPtr *)&local_50,stream);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
                  *)&(this->super_IFF_Layer3).m_vStdVarRecs,
                 (KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_50);
      local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00313e88;
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::unRef
                ((KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_50);
      uVar4 = uVar4 + 1;
    } while (uVar4 < *T);
  }
  return;
}

Assistant:

void IFF_Layer3Interrogator::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( stream.GetBufferSize() < IFF_LAYER3_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vStdVarRecs.clear();

	if( !ignoreHeader )
	{
		LayerHeader::Decode( stream );
	}

	stream >> KDIS_STREAM m_RptSim
		   >> KDIS_STREAM m_BasicData
		   >> m_ui16Padding
		   >> m_ui16NumIffRecs;

	// Use the factory decode function for each standard variable
    for( KUINT16 i = 0; i < m_ui16NumIffRecs; ++i )
    {
        m_vStdVarRecs.push_back( StandardVariable::FactoryDecodeStandardVariable( stream ) );
    }
}